

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_circmod_add(lys_module *module)

{
  ly_ctx *plVar1;
  lys_module **pplVar2;
  ly_modules_list *models;
  lys_module *module_local;
  
  plVar1 = module->ctx;
  (plVar1->models).parsing_sub_modules_count = (plVar1->models).parsing_sub_modules_count + '\x01';
  pplVar2 = (lys_module **)
            ly_realloc((plVar1->models).parsing_sub_modules,
                       (ulong)(plVar1->models).parsing_sub_modules_count << 3);
  (plVar1->models).parsing_sub_modules = pplVar2;
  if ((plVar1->models).parsing_sub_modules == (lys_module **)0x0) {
    ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_check_circmod_add");
    module_local._4_4_ = -1;
  }
  else {
    (plVar1->models).parsing_sub_modules[(int)((plVar1->models).parsing_sub_modules_count - 1)] =
         module;
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
}

Assistant:

int
lyp_check_circmod_add(struct lys_module *module)
{
    struct ly_modules_list *models = &module->ctx->models;

    /* storing - enlarge the list of modules being currently parsed */
    ++models->parsing_sub_modules_count;
    models->parsing_sub_modules = ly_realloc(models->parsing_sub_modules,
                                             models->parsing_sub_modules_count * sizeof *models->parsing_sub_modules);
    LY_CHECK_ERR_RETURN(!models->parsing_sub_modules, LOGMEM(module->ctx), -1);
    models->parsing_sub_modules[models->parsing_sub_modules_count - 1] = module;

    return 0;
}